

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwrapper.cpp
# Opt level: O0

void deleteFixedEnvelope(void *t,bool release_everything)

{
  byte in_SIL;
  FixedEnvelope *in_RDI;
  FixedEnvelope *tt;
  
  if ((in_SIL & 1) != 0) {
    IsoSpec::FixedEnvelope::release_masses(in_RDI);
    IsoSpec::FixedEnvelope::release_probs(in_RDI);
    IsoSpec::FixedEnvelope::release_confs(in_RDI);
  }
  if (in_RDI != (FixedEnvelope *)0x0) {
    (*in_RDI->_vptr_FixedEnvelope[1])();
  }
  return;
}

Assistant:

void deleteFixedEnvelope(void* t, bool release_everything)
{
    FixedEnvelope* tt = reinterpret_cast<FixedEnvelope*>(t);
    if(release_everything)
    {
        tt->release_masses();
        tt->release_probs();
        tt->release_confs();
    }
    delete tt;
}